

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpalette_p.h
# Opt level: O0

void __thiscall QPalettePrivate::Data::Data(Data *this,Data *other)

{
  int iVar1;
  QBrush *in_RDI;
  int role;
  int grp;
  QSharedData *in_stack_ffffffffffffffc8;
  QBrush *this_00;
  QBrush *local_20;
  int local_18;
  int local_14;
  
  QSharedData::QSharedData((QSharedData *)in_RDI,in_stack_ffffffffffffffc8);
  local_20 = in_RDI + 1;
  this_00 = in_RDI + 0x43;
  do {
    QBrush::QBrush(in_RDI);
    local_20 = local_20 + 1;
  } while (local_20 != this_00);
  iVar1 = qt_palette_count + 1;
  *(int *)&in_RDI[0x43].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = qt_palette_count;
  qt_palette_count = iVar1;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 0x16; local_18 = local_18 + 1) {
      QBrush::operator=(this_00,in_RDI);
    }
  }
  return;
}

Assistant:

Data(const Data &other)
            : QSharedData(other)
        {
            for (int grp = 0; grp < int(QPalette::NColorGroups); grp++) {
                for (int role = 0; role < int(QPalette::NColorRoles); role++)
                    br[grp][role] = other.br[grp][role];
            }
        }